

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

size_t EC_get_builtin_curves(EC_builtin_curve *r,size_t nitems)

{
  EC_GROUP *pEVar1;
  EC_GROUP *group;
  size_t i;
  size_t max_num_curves_local;
  EC_builtin_curve *out_curves_local;
  
  i = nitems;
  if (4 < nitems) {
    i = 4;
  }
  for (group = (EC_GROUP *)0x0; group < i; group = (EC_GROUP *)((long)&group->meth + 1)) {
    pEVar1 = (*kAllGroups[(long)group])();
    r[(long)group].nid = pEVar1->curve_name;
    r[(long)group].comment = pEVar1->comment;
  }
  return 4;
}

Assistant:

size_t EC_get_builtin_curves(EC_builtin_curve *out_curves,
                             size_t max_num_curves) {
  if (max_num_curves > OPENSSL_ARRAY_SIZE(kAllGroups)) {
    max_num_curves = OPENSSL_ARRAY_SIZE(kAllGroups);
  }
  for (size_t i = 0; i < max_num_curves; i++) {
    const EC_GROUP *group = kAllGroups[i]();
    out_curves[i].nid = group->curve_name;
    out_curves[i].comment = group->comment;
  }
  return OPENSSL_ARRAY_SIZE(kAllGroups);
}